

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall
pbrt::StatsAccumulator::ReportMemoryCounter(StatsAccumulator *this,char *name,int64_t val)

{
  Stats *pSVar1;
  mapped_type_conflict *pmVar2;
  allocator<char> local_39;
  key_type local_38;
  
  pSVar1 = this->stats;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&pSVar1->memoryCounters,&local_38);
  *pmVar2 = *pmVar2 + val;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void StatsAccumulator::ReportMemoryCounter(const char *name, int64_t val) {
    stats->memoryCounters[name] += val;
}